

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify_certificate_chain.cc
# Opt level: O1

void __thiscall
bssl::anon_unknown_12::PathVerifier::VerifyPolicyMappings
          (PathVerifier *this,ParsedCertificate *cert,CertErrors *errors)

{
  _Rb_tree_header *p_Var1;
  size_t *psVar2;
  byte bVar3;
  byte bVar4;
  pointer pPVar5;
  pointer pmVar6;
  uchar *puVar7;
  uchar *puVar8;
  Input *__k;
  uchar *puVar9;
  Input policy;
  Input lhs;
  uchar *puVar10;
  bool bVar11;
  iterator iVar12;
  vector<bssl::der::Input,std::allocator<bssl::der::Input>> *this_00;
  iterator iVar13;
  ParsedCertificate *pPVar14;
  _Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>,_std::_Select1st<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>
  *this_01;
  pointer pPVar15;
  char *__position;
  uchar *puVar16;
  long lVar17;
  _Self __tmp;
  pointer pPVar18;
  ParsedCertificate *pPVar19;
  ParsedCertificate *pPVar20;
  _Base_ptr p_Var21;
  bool bVar22;
  bool bVar23;
  Input rhs;
  Input rhs_00;
  Input rhs_01;
  Input rhs_02;
  Input rhs_03;
  undefined1 local_88 [16];
  _Rb_tree_node_base local_78;
  ParsedCertificate *local_58;
  pointer local_50;
  pointer local_48;
  key_type local_40;
  
  if (cert->has_policy_mappings_ == true) {
    pPVar15 = (cert->policy_mappings_).
              super__Vector_base<bssl::ParsedPolicyMapping,_std::allocator<bssl::ParsedPolicyMapping>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pPVar5 = (cert->policy_mappings_).
             super__Vector_base<bssl::ParsedPolicyMapping,_std::allocator<bssl::ParsedPolicyMapping>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar22 = pPVar15 == pPVar5;
    __position = (char *)cert;
    if (!bVar22) {
      rhs.data_.size_ = 4;
      rhs.data_.data_ = "U\x1d ";
      bVar11 = bssl::der::operator==((Input)(pPVar15->issuer_domain_policy).data_,rhs);
      while (!bVar11) {
        pPVar18 = pPVar15 + 1;
        __position = (char *)(pPVar15->subject_domain_policy).data_.size_;
        rhs_00.data_.size_ = 4;
        rhs_00.data_.data_ = "U\x1d ";
        bVar11 = bssl::der::operator==((Input)(pPVar15->subject_domain_policy).data_,rhs_00);
        if (bVar11) break;
        bVar22 = pPVar18 == pPVar5;
        if (bVar22) goto LAB_004c34ec;
        rhs_01.data_.size_ = 4;
        rhs_01.data_.data_ = "U\x1d ";
        bVar11 = bssl::der::operator==((Input)(pPVar18->issuer_domain_policy).data_,rhs_01);
        pPVar15 = pPVar18;
      }
      ValidPolicyGraph::SetNull(&this->valid_policy_graph_);
      __position = "PolicyMappings must not map anyPolicy";
      CertErrors::AddError(errors,"PolicyMappings must not map anyPolicy");
      if (!bVar22) {
        return;
      }
    }
LAB_004c34ec:
    if (this->policy_mapping_ != 0) {
      if (cert->has_policy_mappings_ == false) goto LAB_004c38ec;
      pPVar15 = (cert->policy_mappings_).
                super__Vector_base<bssl::ParsedPolicyMapping,_std::allocator<bssl::ParsedPolicyMapping>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pPVar5 = (cert->policy_mappings_).
               super__Vector_base<bssl::ParsedPolicyMapping,_std::allocator<bssl::ParsedPolicyMapping>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pPVar15 != pPVar5) {
        do {
          local_88._0_8_ = (pPVar15->issuer_domain_policy).data_.data_;
          local_88._8_8_ = (pPVar15->issuer_domain_policy).data_.size_;
          local_40.data_.data_ = (pPVar15->subject_domain_policy).data_.data_;
          local_40.data_.size_ = (pPVar15->subject_domain_policy).data_.size_;
          rhs_02.data_.size_ = 4;
          rhs_02.data_.data_ = "U\x1d ";
          bVar22 = bssl::der::operator!=((Input)(pPVar15->issuer_domain_policy).data_,rhs_02);
          if (!bVar22) {
            __assert_fail("issuer_policy != der::Input(kAnyPolicyOid)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/verify_certificate_chain.cc"
                          ,0x2a2,
                          "void bssl::(anonymous namespace)::ValidPolicyGraph::AddPolicyMapping(der::Input, der::Input)"
                         );
          }
          lhs.data_.size_ = local_40.data_.size_;
          lhs.data_.data_ = local_40.data_.data_;
          rhs_03.data_.size_ = 4;
          rhs_03.data_.data_ = "U\x1d ";
          __position = (char *)local_40.data_.size_;
          bVar22 = bssl::der::operator!=(lhs,rhs_03);
          if (!bVar22) {
            __assert_fail("subject_policy != der::Input(kAnyPolicyOid)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/verify_certificate_chain.cc"
                          ,0x2a3,
                          "void bssl::(anonymous namespace)::ValidPolicyGraph::AddPolicyMapping(der::Input, der::Input)"
                         );
          }
          pmVar6 = (this->valid_policy_graph_).levels_.
                   super__Vector_base<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>,_std::allocator<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if ((this->valid_policy_graph_).levels_.
              super__Vector_base<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>,_std::allocator<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != pmVar6) {
            __position = local_88;
            iVar12 = ::std::
                     map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>
                     ::find(pmVar6 + -1,(key_type *)__position);
            if ((_Rb_tree_header *)iVar12._M_node == &pmVar6[-1]._M_t._M_impl.super__Rb_tree_header)
            {
              if ((this->valid_policy_graph_).current_level_.has_any_policy != true)
              goto LAB_004c3635;
              policy.data_.size_ = local_88._8_8_;
              policy.data_.data_ = (uchar *)local_88._0_8_;
              local_78._0_8_ = (void *)0x0;
              local_78._M_parent = (_Base_ptr)0x0;
              local_78._M_left = (_Base_ptr)0x0;
              iVar12 = ValidPolicyGraph::AddNodeReturningIterator
                                 (&this->valid_policy_graph_,policy,
                                  (vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *)
                                  (local_88 + 0x10));
              if ((void *)local_78._0_8_ != (void *)0x0) {
                operator_delete((void *)local_78._0_8_,(long)local_78._M_left - local_78._0_8_);
              }
            }
            *(undefined1 *)&iVar12._M_node[2]._M_parent = 1;
            this_00 = (vector<bssl::der::Input,std::allocator<bssl::der::Input>> *)
                      ::std::
                      map<bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>_>_>
                      ::operator[](&(this->valid_policy_graph_).current_level_.expected_policy_map,
                                   &local_40);
            __position = *(char **)(this_00 + 8);
            if ((Input *)__position == *(Input **)(this_00 + 0x10)) {
              ::std::vector<bssl::der::Input,std::allocator<bssl::der::Input>>::
              _M_realloc_insert<bssl::der::Input_const&>
                        (this_00,(iterator)__position,(Input *)local_88);
            }
            else {
              (((Input *)__position)->data_).data_ = (uchar *)local_88._0_8_;
              (((Input *)__position)->data_).size_ = local_88._8_8_;
              *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x10;
            }
          }
LAB_004c3635:
          pPVar15 = pPVar15 + 1;
        } while (pPVar15 != pPVar5);
      }
    }
    if (this->policy_mapping_ == 0) {
      if (cert->has_policy_mappings_ == false) {
LAB_004c38ec:
        abort();
      }
      p_Var21 = (_Base_ptr)
                (cert->policy_mappings_).
                super__Vector_base<bssl::ParsedPolicyMapping,_std::allocator<bssl::ParsedPolicyMapping>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_50 = (cert->policy_mappings_).
                 super__Vector_base<bssl::ParsedPolicyMapping,_std::allocator<bssl::ParsedPolicyMapping>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if (p_Var21 != (_Base_ptr)local_50) {
        do {
          puVar7 = (((pointer)p_Var21)->issuer_domain_policy).data_.data_;
          puVar8 = (uchar *)(((pointer)p_Var21)->issuer_domain_policy).data_.size_;
          local_48 = (this->valid_policy_graph_).levels_.
                     super__Vector_base<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>,_std::allocator<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          if ((this->valid_policy_graph_).levels_.
              super__Vector_base<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>,_std::allocator<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != local_48) {
            p_Var1 = &local_48[-1]._M_t._M_impl.super__Rb_tree_header;
            local_58 = (ParsedCertificate *)
                       local_48[-1]._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            iVar13._M_node = &p_Var1->_M_header;
            pPVar19 = (ParsedCertificate *)p_Var1;
            local_78._0_8_ = puVar7;
            local_78._M_parent = (_Base_ptr)puVar8;
            if (local_58 != (ParsedCertificate *)0x0) {
              puVar10 = puVar8 + -1;
              __position = (char *)local_58;
              do {
                __k = (Input *)(((ParsedCertificate *)__position)->tbs_certificate_tlv_).data_.size_
                ;
                puVar9 = (((ParsedCertificate *)__position)->signature_algorithm_tlv_).data_.data_;
                bVar11 = puVar9 != (uchar *)0x0;
                bVar22 = puVar8 != (uchar *)0x0;
                if ((bVar11) && (puVar8 != (uchar *)0x0)) {
                  puVar16 = (uchar *)0x0;
                  do {
                    bVar3 = puVar16[(long)&__k->data_];
                    bVar4 = puVar16[(long)puVar7];
                    if (bVar3 < bVar4) goto LAB_004c377d;
                    if (bVar3 >= bVar4 && bVar3 != bVar4) goto LAB_004c3730;
                    bVar22 = puVar10 != puVar16;
                  } while ((puVar9 + -1 != puVar16) &&
                          (bVar23 = puVar10 != puVar16, puVar16 = puVar16 + 1, bVar23));
                }
                if (!bVar22) {
LAB_004c3730:
                  iVar13._M_node = (_Base_ptr)__position;
                  if ((puVar8 != (uchar *)0x0) && (puVar9 != (uchar *)0x0)) {
                    puVar16 = (uchar *)0x0;
                    do {
                      bVar3 = puVar16[(long)puVar7];
                      bVar4 = puVar16[(long)&__k->data_];
                      if (bVar3 < bVar4) {
                        lVar17 = 0x10;
                        goto LAB_004c3780;
                      }
                      if (bVar3 >= bVar4 && bVar3 != bVar4) goto LAB_004c37a0;
                      bVar11 = puVar9 + -1 != puVar16;
                    } while ((puVar10 != puVar16) &&
                            (bVar22 = puVar9 + -1 != puVar16, puVar16 = puVar16 + 1, bVar22));
                  }
                  lVar17 = 0x10;
                  if (bVar11) goto LAB_004c3780;
LAB_004c37a0:
                  pPVar14 = (ParsedCertificate *)
                            (((ParsedCertificate *)__position)->tbs_certificate_tlv_).data_.data_;
                  local_78._M_right = p_Var21;
                  iVar13 = ::std::
                           _Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>,_std::_Select1st<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>
                           ::_M_lower_bound((_Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>,_std::_Select1st<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>
                                             *)(((ParsedCertificate *)__position)->cert_).data_.
                                               size_,(_Link_type)__position,
                                            (_Base_ptr)(local_88 + 0x10),__k);
                  for (; p_Var21 = local_78._M_right, pPVar14 != (ParsedCertificate *)0x0;
                      pPVar14 = *(ParsedCertificate **)
                                 ((long)&(pPVar14->cert_data_)._M_t.
                                         super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>
                                         .super__Head_base<0UL,_crypto_buffer_st_*,_false>.
                                         _M_head_impl + lVar17)) {
                    puVar9 = (pPVar14->signature_algorithm_tlv_).data_.data_;
                    bVar22 = puVar9 != (uchar *)0x0;
                    pPVar20 = pPVar14;
                    if ((puVar8 != (uchar *)0x0) && (puVar9 != (uchar *)0x0)) {
                      __position = (char *)(pPVar14->tbs_certificate_tlv_).data_.size_;
                      puVar16 = (uchar *)0x0;
                      do {
                        bVar3 = puVar16[(long)puVar7];
                        bVar4 = puVar16[(long)&((ParsedCertificate *)__position)->cert_data_];
                        if (bVar3 < bVar4) {
                          lVar17 = 0x10;
                          goto LAB_004c3823;
                        }
                        if (bVar3 >= bVar4 && bVar3 != bVar4) goto LAB_004c3811;
                        bVar22 = puVar9 + -1 != puVar16;
                      } while ((puVar10 != puVar16) &&
                              (bVar11 = puVar9 + -1 != puVar16, puVar16 = puVar16 + 1, bVar11));
                    }
                    lVar17 = 0x10;
                    if (!bVar22) {
LAB_004c3811:
                      lVar17 = 0x18;
                      pPVar20 = pPVar19;
                    }
LAB_004c3823:
                    pPVar19 = pPVar20;
                  }
                  break;
                }
LAB_004c377d:
                lVar17 = 0x18;
                iVar13._M_node = (_Base_ptr)pPVar19;
LAB_004c3780:
                __position = *(char **)((long)&(((ParsedCertificate *)__position)->cert_data_)._M_t.
                                               super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>
                                               .super__Head_base<0UL,_crypto_buffer_st_*,_false>.
                                               _M_head_impl + lVar17);
                pPVar19 = (ParsedCertificate *)iVar13._M_node;
              } while ((ParsedCertificate *)__position != (ParsedCertificate *)0x0);
            }
            pmVar6 = local_48;
            if (((ParsedCertificate *)
                 local_48[-1]._M_t._M_impl.super__Rb_tree_header._M_header._M_left ==
                 (ParsedCertificate *)iVar13._M_node) && ((ParsedCertificate *)p_Var1 == pPVar19)) {
              ::std::
              _Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>,_std::_Select1st<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>
              ::_M_erase((_Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>,_std::_Select1st<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>
                          *)local_58,(_Link_type)__position);
              pmVar6[-1]._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              pmVar6[-1]._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
              pmVar6[-1]._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
              pmVar6[-1]._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            }
            else {
              while ((ParsedCertificate *)iVar13._M_node != pPVar19) {
                pPVar14 = (ParsedCertificate *)::std::_Rb_tree_increment(iVar13._M_node);
                __position = (char *)p_Var1;
                this_01 = (_Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>,_std::_Select1st<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>
                           *)::std::_Rb_tree_rebalance_for_erase(iVar13._M_node,&p_Var1->_M_header);
                ::std::
                _Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>,_std::_Select1st<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>
                ::_M_drop_node(this_01,(_Link_type)__position);
                psVar2 = &pmVar6[-1]._M_t._M_impl.super__Rb_tree_header._M_node_count;
                *psVar2 = *psVar2 - 1;
                iVar13._M_node = (_Base_ptr)pPVar14;
              }
            }
          }
          p_Var21 = (_Base_ptr)((pointer)p_Var21 + 1);
        } while (p_Var21 != (_Base_ptr)local_50);
      }
    }
  }
  return;
}

Assistant:

void PathVerifier::VerifyPolicyMappings(const ParsedCertificate &cert,
                                        CertErrors *errors) {
  if (!cert.has_policy_mappings()) {
    return;
  }

  // From RFC 5280 section 6.1.4:
  //
  //  (a)  If a policy mappings extension is present, verify that the
  //       special value anyPolicy does not appear as an
  //       issuerDomainPolicy or a subjectDomainPolicy.
  for (const ParsedPolicyMapping &mapping : cert.policy_mappings()) {
    if (mapping.issuer_domain_policy == der::Input(kAnyPolicyOid) ||
        mapping.subject_domain_policy == der::Input(kAnyPolicyOid)) {
      // Because this implementation continues processing certificates after
      // this error, clear the valid policy graph to ensure the
      // "user_constrained_policy_set" output upon failure is empty.
      valid_policy_graph_.SetNull();
      errors->AddError(cert_errors::kPolicyMappingAnyPolicy);
      return;
    }
  }

  //  (b)  If a policy mappings extension is present, then for each
  //       issuerDomainPolicy ID-P in the policy mappings extension:
  //
  //     (1)  If the policy_mapping variable is greater than 0, for each
  //          node in the valid_policy_tree of depth i where ID-P is the
  //          valid_policy, set expected_policy_set to the set of
  //          subjectDomainPolicy values that are specified as
  //          equivalent to ID-P by the policy mappings extension.
  //
  //          If no node of depth i in the valid_policy_tree has a
  //          valid_policy of ID-P but there is a node of depth i with a
  //          valid_policy of anyPolicy, then generate a child node of
  //          the node of depth i-1 that has a valid_policy of anyPolicy
  //          as follows:
  //
  //        (i)    set the valid_policy to ID-P;
  //
  //        (ii)   set the qualifier_set to the qualifier set of the
  //               policy anyPolicy in the certificate policies
  //               extension of certificate i; and
  //
  //        (iii)  set the expected_policy_set to the set of
  //               subjectDomainPolicy values that are specified as
  //               equivalent to ID-P by the policy mappings extension.
  //
  if (policy_mapping_ > 0) {
    for (const ParsedPolicyMapping &mapping : cert.policy_mappings()) {
      valid_policy_graph_.AddPolicyMapping(mapping.issuer_domain_policy,
                                           mapping.subject_domain_policy);
    }
  }

  //  (b)  If a policy mappings extension is present, then for each
  //       issuerDomainPolicy ID-P in the policy mappings extension:
  //
  //  ...
  //
  //     (2)  If the policy_mapping variable is equal to 0:
  //
  //        (i)    delete each node of depth i in the valid_policy_tree
  //               where ID-P is the valid_policy.
  //
  //        (ii)   If there is a node in the valid_policy_tree of depth
  //               i-1 or less without any child nodes, delete that
  //               node.  Repeat this step until there are no nodes of
  //               depth i-1 or less without children.
  //
  // Step (ii) is deferred to part of GetUserConstrainedPolicySet().
  if (policy_mapping_ == 0) {
    for (const ParsedPolicyMapping &mapping : cert.policy_mappings()) {
      valid_policy_graph_.DeleteNode(mapping.issuer_domain_policy);
    }
  }
}